

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O3

void printU8Imm(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  cs_struct *h;
  uint id;
  MCOperand *op;
  ulong uVar4;
  uint8_t access [6];
  uint8_t local_1e [6];
  
  op = MCInst_getOperand(MI,Op);
  uVar4 = MCOperand_getImm(op);
  printImm(MI,O,uVar4 & 0xff,true);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x55;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    *(ulong *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x5d) =
         uVar4 & 0xff;
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x75] = '\x01';
    h = MI->csh;
    id = MCInst_getOpcode(MI);
    get_op_access(h,id,local_1e,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
    pcVar3 = MI->flat_insn->detail;
    bVar2 = (pcVar3->field_6).x86.op_count;
    pcVar3->groups[(ulong)((uint)bVar2 * 0x30) + 0x76] = local_1e[bVar2];
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printU8Imm(MCInst *MI, unsigned Op, SStream *O)
{
	uint8_t val = MCOperand_getImm(MCInst_getOperand(MI, Op)) & 0xff;

	printImm(MI, O, val, true);

	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access[6];
#endif

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = val;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = 1;

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
#endif

		MI->flat_insn->detail->x86.op_count++;
	}
}